

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O0

char * apprun_string_list_join(char **string_list,char *split)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  uint local_34;
  int i_1;
  char *str;
  int i;
  uint str_size;
  uint split_len;
  uint string_list_len;
  char *split_local;
  char **string_list_local;
  
  uVar1 = apprun_string_list_len(string_list);
  sVar2 = strlen(split);
  str._4_4_ = 0;
  for (str._0_4_ = 0; (uint)str < uVar1; str._0_4_ = (uint)str + 1) {
    sVar3 = strlen(string_list[(int)(uint)str]);
    str._4_4_ = str._4_4_ + (int)sVar3 + (int)sVar2;
  }
  __dest = (char *)calloc((ulong)str._4_4_,1);
  for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
    strcat(__dest,string_list[(int)local_34]);
    if (local_34 + 1 < uVar1) {
      strcat(__dest,split);
    }
  }
  return __dest;
}

Assistant:

char *apprun_string_list_join(char *const *string_list, char *split) {
    unsigned string_list_len = apprun_string_list_len(string_list);
    unsigned split_len = strlen(split);
    unsigned str_size = 0;

    for (int i = 0; i < string_list_len; i++)
        str_size += strlen(string_list[i]) + split_len;

    char *str = calloc(str_size, sizeof(char));
    for (int i = 0; i < string_list_len; i++) {
        strcat(str, string_list[i]);
        if (i + 1 < string_list_len)
            strcat(str, split);
    }

    return str;
}